

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

bool __thiscall
SoftHSM::setECPrivateKey(SoftHSM *this,OSObject *key,ByteString *ber,Token *token,bool isPrivate)

{
  char cVar1;
  int iVar2;
  CryptoFactory *pCVar3;
  undefined4 extraout_var;
  long *plVar5;
  char *pcVar6;
  ByteString *pBVar7;
  undefined1 uVar8;
  ByteString value;
  ByteString group;
  ByteString local_120;
  ByteString local_f8;
  OSAttribute local_d0;
  long *plVar4;
  
  pCVar3 = CryptoFactory::i();
  iVar2 = (*pCVar3->_vptr_CryptoFactory[2])(pCVar3,5);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar4 != (long *)0x0) {
    plVar5 = (long *)(**(code **)(*plVar4 + 0xb0))(plVar4);
    if (plVar5 != (long *)0x0) {
      cVar1 = (**(code **)(*plVar5 + 0x38))(plVar5,ber);
      if (cVar1 != '\0') {
        ByteString::ByteString(&local_f8);
        ByteString::ByteString(&local_120);
        if (isPrivate) {
          pcVar6 = (char *)(**(code **)(*plVar5 + 0x60))(plVar5);
          Token::encrypt(token,pcVar6,(int)&local_f8);
          pcVar6 = (char *)(**(code **)(*plVar5 + 0x58))(plVar5);
          Token::encrypt(token,pcVar6,(int)&local_120);
        }
        else {
          pBVar7 = (ByteString *)(**(code **)(*plVar5 + 0x60))(plVar5);
          ByteString::operator=(&local_f8,pBVar7);
          pBVar7 = (ByteString *)(**(code **)(*plVar5 + 0x58))(plVar5);
          ByteString::operator=(&local_120,pBVar7);
        }
        OSAttribute::OSAttribute(&local_d0,&local_f8);
        iVar2 = (*key->_vptr_OSObject[8])(key,0x180,&local_d0);
        OSAttribute::~OSAttribute(&local_d0);
        if ((char)iVar2 == '\0') {
          uVar8 = 0;
        }
        else {
          OSAttribute::OSAttribute(&local_d0,&local_120);
          iVar2 = (*key->_vptr_OSObject[8])(key,0x11,&local_d0);
          uVar8 = (undefined1)iVar2;
          OSAttribute::~OSAttribute(&local_d0);
        }
        (**(code **)(*plVar4 + 0xd8))(plVar4,plVar5);
        pCVar3 = CryptoFactory::i();
        (*pCVar3->_vptr_CryptoFactory[3])(pCVar3,plVar4);
        local_120._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_120.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        local_f8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_f8.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
        return (bool)uVar8;
      }
      (**(code **)(*plVar4 + 0xd8))(plVar4,plVar5);
    }
    pCVar3 = CryptoFactory::i();
    (*pCVar3->_vptr_CryptoFactory[3])(pCVar3,plVar4);
  }
  return false;
}

Assistant:

bool SoftHSM::setECPrivateKey(OSObject* key, const ByteString &ber, Token* token, bool isPrivate) const
{
	AsymmetricAlgorithm* ecc = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
	if (ecc == NULL)
		return false;
	PrivateKey* priv = ecc->newPrivateKey();
	if (priv == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	if (!priv->PKCS8Decode(ber))
	{
		ecc->recyclePrivateKey(priv);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	// EC Private Key Attributes
	ByteString group;
	ByteString value;
	if (isPrivate)
	{
		token->encrypt(((ECPrivateKey*)priv)->getEC(), group);
		token->encrypt(((ECPrivateKey*)priv)->getD(), value);
	}
	else
	{
		group = ((ECPrivateKey*)priv)->getEC();
		value = ((ECPrivateKey*)priv)->getD();
	}
	bool bOK = true;
	bOK = bOK && key->setAttribute(CKA_EC_PARAMS, group);
	bOK = bOK && key->setAttribute(CKA_VALUE, value);

	ecc->recyclePrivateKey(priv);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);

	return bOK;
}